

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
                 (char *target,ArrayPtr<const_char> *first,
                 Delimited<kj::ArrayPtr<const_unsigned_char>_> *rest)

{
  char *pcVar1;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *first_00;
  char *end;
  char *i;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *rest_local;
  ArrayPtr<const_char> *first_local;
  char *target_local;
  
  end = ArrayPtr<const_char>::begin(first);
  pcVar1 = ArrayPtr<const_char>::end(first);
  first_local = (ArrayPtr<const_char> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->ptr = *end;
    end = end + 1;
    first_local = (ArrayPtr<const_char> *)((long)&first_local->ptr + 1);
  }
  first_00 = fwd<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>(rest);
  pcVar1 = fill<kj::ArrayPtr<unsigned_char_const>>((char *)first_local,first_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}